

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS
ref_geom_bspline_fit(REF_INT degree,REF_INT n_control_point,REF_DBL *t,REF_DBL *uv,REF_DBL *bundle)

{
  REF_DBL RVar1;
  undefined1 auVar2 [16];
  REF_STATUS RVar3;
  REF_DBL *ab;
  REF_DBL *N;
  REF_DBL *pRVar4;
  ulong uVar5;
  undefined8 uVar6;
  long lVar7;
  REF_DBL *pRVar8;
  uint uVar9;
  double *pdVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  long lVar14;
  uint uVar15;
  int cols;
  double *pdVar16;
  REF_DBL *pRVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  long lVar26;
  
  auVar2 = _DAT_00221120;
  uVar11 = (ulong)(uint)n_control_point;
  uVar9 = n_control_point + 1 + degree;
  if (-1 < n_control_point + degree) {
    lVar7 = (ulong)uVar9 - 1;
    auVar21._8_4_ = (int)lVar7;
    auVar21._0_8_ = lVar7;
    auVar21._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar12 = 0;
    auVar21 = auVar21 ^ _DAT_00221120;
    auVar28 = _DAT_00221110;
    do {
      auVar27 = auVar28 ^ auVar2;
      if ((bool)(~(auVar27._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar27._0_4_ ||
                  auVar21._4_4_ < auVar27._4_4_) & 1)) {
        bundle[uVar12] = -1.0;
      }
      if ((auVar27._12_4_ != auVar21._12_4_ || auVar27._8_4_ <= auVar21._8_4_) &&
          auVar27._12_4_ <= auVar21._12_4_) {
        bundle[uVar12 + 1] = -1.0;
      }
      uVar12 = uVar12 + 2;
      lVar7 = auVar28._8_8_;
      auVar28._0_8_ = auVar28._0_8_ + 2;
      auVar28._8_8_ = lVar7 + 2;
    } while (((ulong)uVar9 + 1 & 0x1fffffffe) != uVar12);
  }
  auVar2 = _DAT_00221120;
  if (-1 < degree) {
    RVar1 = *t;
    auVar24._4_4_ = 0;
    auVar24._0_4_ = degree;
    auVar24._8_4_ = degree;
    auVar24._12_4_ = 0;
    lVar7 = 0;
    auVar24 = auVar24 ^ _DAT_00221120;
    auVar27 = _DAT_00221110;
    do {
      auVar28 = auVar27 ^ auVar2;
      if ((bool)(~(auVar28._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar28._0_4_ ||
                  auVar24._4_4_ < auVar28._4_4_) & 1)) {
        *(REF_DBL *)((long)bundle + lVar7) = RVar1;
      }
      if ((auVar28._12_4_ != auVar24._12_4_ || auVar28._8_4_ <= auVar24._8_4_) &&
          auVar28._12_4_ <= auVar24._12_4_) {
        *(REF_DBL *)((long)bundle + lVar7 + 8) = RVar1;
      }
      lVar26 = auVar27._8_8_;
      auVar27._0_8_ = auVar27._0_8_ + 2;
      auVar27._8_8_ = lVar26 + 2;
      lVar7 = lVar7 + 0x10;
    } while ((ulong)((uint)degree >> 1 & 0x3fffffff) * 0x10 + 0x10 != lVar7);
  }
  if (degree < n_control_point + -1) {
    pdVar10 = t + 1;
    lVar7 = 0x200000000;
    uVar12 = 1;
    do {
      lVar26 = uVar12 + (long)degree;
      bundle[lVar26] = 0.0;
      if (0 < degree) {
        dVar23 = 0.0;
        lVar14 = lVar7;
        pdVar16 = pdVar10;
        do {
          dVar23 = dVar23 + *pdVar16 / (double)degree;
          bundle[lVar26] = dVar23;
          lVar19 = lVar14 >> 0x20;
          pdVar16 = pdVar16 + 1;
          lVar14 = lVar14 + 0x100000000;
        } while (lVar19 < lVar26);
      }
      uVar12 = uVar12 + 1;
      pdVar10 = pdVar10 + 1;
      lVar7 = lVar7 + 0x100000000;
    } while (uVar12 != (uint)(n_control_point - degree));
  }
  auVar2 = _DAT_00221120;
  uVar18 = n_control_point * 2;
  cols = n_control_point * 2 + 1;
  if (-1 < degree) {
    RVar1 = t[n_control_point + -1];
    auVar22._4_4_ = 0;
    auVar22._0_4_ = degree;
    auVar22._8_4_ = degree;
    auVar22._12_4_ = 0;
    lVar7 = 0;
    auVar22 = auVar22 ^ _DAT_00221120;
    auVar25 = _DAT_00221110;
    do {
      auVar28 = auVar25 ^ auVar2;
      if ((bool)(~(auVar28._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar28._0_4_ ||
                  auVar22._4_4_ < auVar28._4_4_) & 1)) {
        *(REF_DBL *)((long)bundle + lVar7 + (long)n_control_point * 8) = RVar1;
      }
      if ((auVar28._12_4_ != auVar22._12_4_ || auVar28._8_4_ <= auVar22._8_4_) &&
          auVar28._12_4_ <= auVar22._12_4_) {
        *(REF_DBL *)((long)bundle + lVar7 + (long)n_control_point * 8 + 8) = RVar1;
      }
      lVar26 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 2;
      auVar25._8_8_ = lVar26 + 2;
      lVar7 = lVar7 + 0x10;
    } while ((ulong)((uint)degree >> 1 & 0x3fffffff) * 0x10 + 0x10 != lVar7);
  }
  uVar15 = cols * uVar18;
  if ((int)uVar15 < 0) {
    pcVar13 = "malloc ab of REF_DBL negative";
    uVar6 = 0x111f;
LAB_00179066:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar6,
           "ref_geom_bspline_fit",pcVar13);
    return 1;
  }
  ab = (REF_DBL *)malloc((ulong)uVar15 << 3);
  if (ab == (REF_DBL *)0x0) {
    pcVar13 = "malloc ab of REF_DBL NULL";
    uVar6 = 0x111f;
LAB_0017910d:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar6,
           "ref_geom_bspline_fit",pcVar13);
    RVar3 = 2;
  }
  else {
    if (n_control_point == 0) {
      N = (REF_DBL *)malloc(0);
      if (N == (REF_DBL *)0x0) {
LAB_001790ec:
        pcVar13 = "malloc N of REF_DBL NULL";
        uVar6 = 0x1120;
        goto LAB_0017910d;
      }
      uVar18 = ref_matrix_solve_ab(uVar18,cols,ab);
      if (uVar18 != 0) {
LAB_001790c1:
        pcVar13 = "solve";
        uVar6 = 0x1135;
        uVar11 = (ulong)uVar18;
LAB_00179183:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               uVar6,"ref_geom_bspline_fit",uVar11,pcVar13);
        return uVar18;
      }
    }
    else {
      memset(ab,0,(ulong)(uVar15 + (uVar15 == 0)) << 3);
      if (n_control_point < 0) {
        pcVar13 = "malloc N of REF_DBL negative";
        uVar6 = 0x1120;
        goto LAB_00179066;
      }
      N = (REF_DBL *)malloc(uVar11 * 8);
      if (N == (REF_DBL *)0x0) goto LAB_001790ec;
      uVar15 = uVar18 * uVar18;
      uVar12 = (ulong)uVar18;
      pRVar8 = (REF_DBL *)((uVar12 * 8 + 8) * uVar11 + (long)ab);
      uVar20 = 0;
      pRVar17 = ab;
      do {
        RVar3 = ref_geom_bspline_row(degree,n_control_point,bundle,t[uVar20],N);
        if (RVar3 != 0) {
          pcVar13 = "row";
          uVar18 = 1;
          uVar6 = 0x1122;
          uVar11 = 1;
          goto LAB_00179183;
        }
        uVar5 = 0;
        pRVar4 = pRVar17;
        do {
          *pRVar4 = N[uVar5];
          uVar5 = uVar5 + 1;
          pRVar4 = pRVar4 + uVar12;
        } while (uVar11 != uVar5);
        ab[uVar15 + uVar20] = uv[uVar20 * 2];
        uVar5 = 0;
        pRVar4 = pRVar8;
        do {
          *pRVar4 = N[uVar5];
          uVar5 = uVar5 + 1;
          pRVar4 = pRVar4 + uVar12;
        } while (uVar11 != uVar5);
        ab[(uVar15 + n_control_point) + uVar20] = uv[uVar20 * 2 + 1];
        uVar20 = uVar20 + 1;
        pRVar17 = pRVar17 + 1;
        pRVar8 = pRVar8 + 1;
      } while (uVar20 != uVar11);
      uVar18 = ref_matrix_solve_ab(uVar18,cols,ab);
      if (uVar18 != 0) goto LAB_001790c1;
      if (n_control_point != 0) {
        lVar7 = 0;
        do {
          bundle[(int)uVar9 + lVar7] = *(REF_DBL *)((long)ab + lVar7 * 4 + (ulong)uVar15 * 8);
          bundle[n_control_point + degree + 2 + (int)lVar7] =
               *(REF_DBL *)((long)ab + lVar7 * 4 + (ulong)(uVar15 + n_control_point) * 8);
          lVar7 = lVar7 + 2;
        } while (uVar11 * 2 != lVar7);
      }
    }
    free(N);
    free(ab);
    RVar3 = 0;
  }
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bspline_fit(REF_INT degree, REF_INT n_control_point,
                                        REF_DBL *t, REF_DBL *uv,
                                        REF_DBL *bundle) {
  REF_INT rows = 2 * n_control_point;
  REF_INT cols = 2 * n_control_point + 1;
  REF_DBL *ab;
  REF_DBL *N;
  REF_INT nknot = ref_geom_bspline_nknot(degree, n_control_point);
  REF_INT i, j;
  REF_INT row, col;

  for (i = 0; i < nknot; i++) {
    bundle[i] = -1.0;
  }
  for (i = 0; i < degree + 1; i++) {
    bundle[i] = t[0];
  }
  for (j = 1; j <= ref_geom_bspline_n(degree, n_control_point) - degree; j++) {
    bundle[j + degree] = 0.0;
    for (i = j; i <= j + degree - 1; i++)
      bundle[j + degree] += t[i] / ((REF_DBL)degree);
  }
  for (i = 0; i < degree + 1; i++) {
    bundle[i + n_control_point] = t[n_control_point - 1];
  }
  ref_malloc_init(ab, rows * cols, REF_DBL, 0.0);
  ref_malloc(N, n_control_point, REF_DBL);
  for (i = 0; i < n_control_point; i++) {
    RSS(ref_geom_bspline_row(degree, n_control_point, bundle, t[i], N), "row");
    for (j = 0; j < n_control_point; j++) {
      row = i;
      col = j;
      ab[row + col * rows] = N[j];
    }
    row = i;
    col = 2 * n_control_point;
    ab[row + col * rows] = uv[0 + 2 * i];
    for (j = 0; j < n_control_point; j++) {
      row = i + n_control_point;
      col = j + n_control_point;
      ab[row + col * rows] = N[j];
    }
    row = i + n_control_point;
    col = 2 * n_control_point;
    ab[row + col * rows] = uv[1 + 2 * i];
  }

  RSS(ref_matrix_solve_ab(rows, cols, ab), "solve");
  for (i = 0; i < n_control_point; i++) {
    row = i;
    col = 2 * n_control_point;
    bundle[0 + 2 * i + nknot] = ab[row + col * rows];
    row = i + n_control_point;
    col = 2 * n_control_point;
    bundle[1 + 2 * i + nknot] = ab[row + col * rows];
  }
  ref_free(N);
  ref_free(ab);
  return REF_SUCCESS;
}